

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

int float128_compare_internal(float128 a,float128 b,int is_quiet,float_status *status)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar3 = b.high;
  uVar4 = b.low;
  uVar5 = a.high;
  uVar6 = a.low;
  if ((((~uVar5 & 0x7fff000000000000) == 0) &&
      (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
       uVar6 != 0)) ||
     (((~uVar3 & 0x7fff000000000000) == 0 &&
      (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
       uVar4 != 0)))) {
    iVar1 = 2;
    if (((is_quiet == 0) ||
        (((uVar5 & 0x7fff800000000000) == 0x7fff000000000000 &&
         (((undefined1  [16])a & (undefined1  [16])0x7fffffffffff) != (undefined1  [16])0x0 ||
          uVar6 != 0)))) ||
       (((uVar3 & 0x7fff800000000000) == 0x7fff000000000000 &&
        (((undefined1  [16])b & (undefined1  [16])0x7fffffffffff) != (undefined1  [16])0x0 ||
         uVar4 != 0)))) {
      status->float_exception_flags = status->float_exception_flags | 1;
      return 2;
    }
  }
  else {
    if (uVar5 >> 0x3f == uVar3 >> 0x3f) {
      if (uVar5 == uVar3 && uVar6 == uVar4) {
        return 0;
      }
      uVar2 = (uint)(byte)(((uVar6 < uVar4 && uVar5 == uVar3 || uVar5 < uVar3) ^ a.high._7_1_ >> 7)
                          * '\x02');
    }
    else {
      if ((((uVar3 | uVar5) & 0x7fffffffffffffff) == 0 && uVar6 == 0) && uVar4 == 0) {
        return 0;
      }
      uVar2 = (a.high._4_4_ >> 0x1f) * -2 & 0xff;
    }
    iVar1 = 1 - uVar2;
  }
  return iVar1;
}

Assistant:

static inline int float128_compare_internal(float128 a, float128 b,
                                            int is_quiet, float_status *status)
{
    flag aSign, bSign;

    if (( ( extractFloat128Exp( a ) == 0x7fff ) &&
          ( extractFloat128Frac0( a ) | extractFloat128Frac1( a ) ) ) ||
        ( ( extractFloat128Exp( b ) == 0x7fff ) &&
          ( extractFloat128Frac0( b ) | extractFloat128Frac1( b ) ) )) {
        if (!is_quiet ||
            float128_is_signaling_nan(a, status) ||
            float128_is_signaling_nan(b, status)) {
            float_raise(float_flag_invalid, status);
        }
        return float_relation_unordered;
    }
    aSign = extractFloat128Sign( a );
    bSign = extractFloat128Sign( b );
    if ( aSign != bSign ) {
        if ( ( ( ( a.high | b.high )<<1 ) | a.low | b.low ) == 0 ) {
            /* zero case */
            return float_relation_equal;
        } else {
            return 1 - (2 * aSign);
        }
    } else {
        if (a.low == b.low && a.high == b.high) {
            return float_relation_equal;
        } else {
            return 1 - 2 * (aSign ^ ( lt128( a.high, a.low, b.high, b.low ) ));
        }
    }
}